

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::AdapterPromiseNode<unsigned_int,kj::_::PromiseAndFulfillerAdapter<unsigned_int>>::
AdapterPromiseNode<kj::_::WeakFulfiller<unsigned_int>&>
          (AdapterPromiseNode<unsigned_int,kj::_::PromiseAndFulfillerAdapter<unsigned_int>> *this,
          WeakFulfiller<unsigned_int> *params)

{
  WeakFulfiller<unsigned_int> *wrapper;
  WeakFulfiller<unsigned_int> *params_local;
  AdapterPromiseNode<unsigned_int,_kj::_::PromiseAndFulfillerAdapter<unsigned_int>_> *this_local;
  
  AdapterPromiseNodeBase::AdapterPromiseNodeBase((AdapterPromiseNodeBase *)this);
  PromiseFulfiller<unsigned_int>::PromiseFulfiller((PromiseFulfiller<unsigned_int> *)(this + 0x10));
  *(undefined ***)this = &PTR_onReady_00cd7ce8;
  *(undefined ***)(this + 0x10) = &PTR_fulfill_00cd7d30;
  ExceptionOr<unsigned_int>::ExceptionOr((ExceptionOr<unsigned_int> *)(this + 0x18));
  this[0x180] = (AdapterPromiseNode<unsigned_int,kj::_::PromiseAndFulfillerAdapter<unsigned_int>>)
                0x1;
  wrapper = fwd<kj::_::WeakFulfiller<unsigned_int>&>(params);
  PromiseAndFulfillerAdapter<unsigned_int>::PromiseAndFulfillerAdapter
            ((PromiseAndFulfillerAdapter<unsigned_int> *)(this + 0x188),
             (PromiseFulfiller<unsigned_int> *)(this + 0x10),wrapper);
  return;
}

Assistant:

AdapterPromiseNode(Params&&... params)
      : adapter(static_cast<PromiseFulfiller<UnfixVoid<T>>&>(*this), kj::fwd<Params>(params)...) {}